

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Date * operator++(Date *date)

{
  int iVar1;
  
  iVar1 = date->day;
  date->day = iVar1 + 1;
  if (0x1e < iVar1) {
    date->month = date->month + 1;
    date->day = 1;
  }
  if (0xc < date->month) {
    date->year = date->year + 1;
    date->month = 1;
  }
  return date;
}

Assistant:

Date &operator++(Date &date) {
    date.day++;
    if (date.day > 31) {
        date.month++;
        date.day = 1;
    }
    if (date.month > 12) {
        date.year++;
        date.month = 1;
    }
    return date;
}